

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t __thiscall
andres::
BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::shape(BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        *this,size_t j)

{
  size_t sVar1;
  size_t sVar2;
  BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  *pBVar3;
  
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e1_);
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  pBVar3 = (BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
            *)&this->e2_;
  if (sVar2 <= sVar1) {
    pBVar3 = this;
  }
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::shape(pBVar3->e1_,j);
  return sVar1;
}

Assistant:

const std::size_t shape(const std::size_t j) const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shape(j) : e1_.shape(j); }